

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<QByteArray,_QByteArray>_>::freeData
          (Span<QHashPrivate::Node<QByteArray,_QByteArray>_> *this)

{
  uchar *puVar1;
  int *piVar2;
  ulong uVar3;
  long lVar4;
  
  if (this->entries != (Entry *)0x0) {
    lVar4 = 0;
    do {
      if (this->offsets[lVar4] != 0xff) {
        uVar3 = (ulong)((uint)this->offsets[lVar4] * 0x30);
        puVar1 = (this->entries->storage).data + uVar3;
        piVar2 = *(int **)((this->entries->storage).data + uVar3 + 0x18);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            QArrayData::deallocate(*(QArrayData **)(puVar1 + 0x18),1,0x10);
          }
        }
        piVar2 = *(int **)puVar1;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            QArrayData::deallocate(*(QArrayData **)puVar1,1,0x10);
          }
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x80);
    if (this->entries != (Entry *)0x0) {
      operator_delete__(this->entries);
    }
    this->entries = (Entry *)0x0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }